

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

string * __thiscall
HPresolve::getDualsForcingRow_abi_cxx11_
          (string *__return_storage_ptr__,HPresolve *this,int row,
          vector<int,_std::allocator<int>_> *fRjs)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  ostream *poVar9;
  pointer pdVar10;
  pointer piVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  _Elt_pointer ppVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  double dVar25;
  double up;
  double lo;
  vector<double,_std::allocator<double>_> v;
  pair<int,_std::vector<double,_std::allocator<double>_>_> p;
  stringstream ss;
  double local_210;
  double local_208;
  KktChStep *local_200;
  vector<int,_std::allocator<int>_> *local_1f8;
  vector<double,_std::allocator<double>_> local_1f0;
  int local_1d8;
  vector<double,_std::allocator<double>_> local_1d0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_208 = -1e+200;
  local_210 = 1e+200;
  piVar11 = (fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if ((fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar11) {
    uVar17 = 0;
    do {
      ppVar18 = (this->super_HPreData).oldBounds.c.
                super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVar18 ==
          *(_Elt_pointer *)
           ((long)&(this->super_HPreData).oldBounds.c.
                   super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish + 8)) {
        ppVar18 = (*(_Map_pointer *)
                    ((long)&(this->super_HPreData).oldBounds.c.
                            super__Deque_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish + 0x18))[-1] + 0x10;
      }
      iVar2 = piVar11[uVar17];
      local_1d8 = ppVar18[-1].first;
      std::vector<double,_std::allocator<double>_>::vector(&local_1d0,&ppVar18[-1].second);
      std::vector<double,_std::allocator<double>_>::vector(&local_1f0,&local_1d0);
      std::
      deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
      ::pop_back(&(this->super_HPreData).oldBounds.c);
      getBoundOnLByZj(this,row,iVar2,&local_208,&local_210,
                      *local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                      local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
      if (local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar17 = uVar17 + 1;
      piVar11 = (fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar11 >> 2));
  }
  dVar25 = local_208;
  dVar1 = local_210;
  if (local_210 < local_208) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PR: Error in postsolving forcing row ",0x25);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,row);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9," : inconsistent bounds for it\'s dual value.\n",0x2c);
  }
  if ((0.0 < dVar25) || (dVar1 < 0.0)) {
    if (dVar25 <= 0.0) {
      if (0.0 <= dVar1) goto LAB_0014923c;
      pdVar10 = (this->super_HPreData).valueRowDual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      dVar25 = dVar1;
      if ((ulong)((long)(this->super_HPreData).valueRowDual.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar10 >> 3) <= (ulong)(long)row)
      goto LAB_001494fe;
    }
    else {
      pdVar10 = (this->super_HPreData).valueRowDual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      if ((ulong)((long)(this->super_HPreData).valueRowDual.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar10 >> 3) <= (ulong)(long)row)
      goto LAB_001494fe;
    }
    pdVar10[row] = dVar25;
  }
  else {
    pdVar10 = (this->super_HPreData).valueRowDual.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    if ((ulong)((long)(this->super_HPreData).valueRowDual.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar10 >> 3) <= (ulong)(long)row)
    goto LAB_001494fe;
    pdVar10[row] = 0.0;
  }
LAB_0014923c:
  piVar11 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(long)row <
      (ulong)((long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar11 >> 2)) {
    piVar11[row] = 1;
    piVar11 = (fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
    if ((fRjs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar11) {
      local_200 = &(this->super_HPreData).chk;
      uVar17 = 0;
      local_1f8 = fRjs;
      do {
        pvVar8 = local_1f8;
        iVar2 = piVar11[uVar17];
        uVar15 = (ulong)iVar2;
        pdVar10 = (this->super_HPreData).valueColDual.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).valueColDual.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar10 >> 3) <= uVar15) {
LAB_001494ed:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar15);
        }
        piVar11 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar13 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar11 >> 2;
        uVar16 = uVar15;
        if (uVar13 <= uVar15) {
LAB_001494dc:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar16,uVar13);
        }
        piVar5 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
        uVar13 = uVar12;
        if (uVar12 <= uVar15) goto LAB_001494dc;
        iVar3 = piVar11[uVar15];
        uVar22 = (ulong)iVar3;
        iVar4 = piVar5[uVar15];
        piVar11 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar14 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar11 >> 2;
        piVar5 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar20 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
        pdVar6 = (this->super_HPreData).valueRowDual.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar21 = (long)(this->super_HPreData).valueRowDual.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
        pdVar7 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar24 = (long)(this->super_HPreData).Avalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
        if (iVar4 < iVar3) {
          iVar4 = iVar3;
        }
        dVar1 = pdVar10[uVar15];
        dVar25 = 0.0;
        uVar19 = uVar22;
        while ((long)iVar4 != uVar19) {
          if (uVar14 <= uVar19) {
            uVar13 = uVar14;
            uVar16 = uVar22;
            if (uVar22 < uVar14) {
              uVar16 = uVar14;
            }
            goto LAB_001494dc;
          }
          uVar23 = (ulong)piVar11[uVar19];
          uVar13 = uVar20;
          uVar16 = uVar23;
          if (uVar20 <= uVar23) goto LAB_001494dc;
          if (piVar5[uVar23] != 0) {
            uVar13 = uVar21;
            if ((uVar21 <= uVar23) || (uVar13 = uVar24, uVar16 = uVar19, uVar24 <= uVar19))
            goto LAB_001494dc;
            dVar25 = dVar25 + pdVar6[uVar23] * pdVar7[uVar19];
          }
          uVar19 = uVar19 + 1;
          uVar13 = uVar12;
          uVar16 = uVar15;
          if (uVar12 <= uVar15) goto LAB_001494dc;
        }
        pdVar10[uVar15] = dVar25 + dVar1;
        if (this->iKKTcheck == 1) {
          std::ostream::operator<<(local_1a8,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
          pdVar10 = (this->super_HPreData).valuePrimal.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((ulong)((long)(this->super_HPreData).valuePrimal.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar10 >> 3) <= uVar15) ||
             (pdVar6 = (this->super_HPreData).valueColDual.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
             (ulong)((long)(this->super_HPreData).valueColDual.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar15))
          goto LAB_001494ed;
          KktChStep::addChange(local_200,2,0,iVar2,pdVar10[uVar15],pdVar6[uVar15],dVar1);
        }
        uVar17 = uVar17 + 1;
        piVar11 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar17 < (ulong)((long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar11 >> 2
                               ));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return __return_storage_ptr__;
  }
LAB_001494fe:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

string HPresolve::getDualsForcingRow( int row, vector<int>& fRjs) {
	double z;
	stringstream ss;
	int j;

	double lo = -HSOL_CONST_INF;
	double up = HSOL_CONST_INF;

	double cost, sum;

	for (size_t jj=0;jj<fRjs.size();++jj) {
			j = fRjs[jj];

			pair<int, vector<double> > p = oldBounds.top();
			vector<double> v = get<1>(p);
			oldBounds.pop();
			double colLow = v[0];
			double colUpp = v[1];


			//calculate bound x imposed by zj
			getBoundOnLByZj(row, j, &lo, &up, colLow, colUpp);
		}

	//calculate yi
	if (lo>up)
		cout<<"PR: Error in postsolving forcing row "<<row <<" : inconsistent bounds for it's dual value.\n";

	if (lo<=0 && up>=0) {
		valueRowDual.at(row) = 0;
	}
	else if (lo>0) {
		valueRowDual.at(row) = lo;
	}
	else if (up<0) {
		valueRowDual.at(row) = up;
	}

	flagRow.at(row) = 1;


	for (size_t jj=0;jj<fRjs.size();++jj) {
			j = fRjs[jj];
			cost = valueColDual.at(j);
			sum = 0;
			for (int k=Astart.at(j); k<Aend.at(j);++k )
				if (flagRow.at(Aindex.at(k))) {
					sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);
					//cout<<" row "<<Aindex.at(k)<<" dual "<<valueRowDual.at(Aindex.at(k))<<" a_"<<Aindex.at(k)<<"_"<<j<<"\n";
				}
			z = cost + sum;

			valueColDual.at(j) = z;

			if (iKKTcheck == 1) {
				ss<<j;
				ss<<" ";
				chk.addChange(2, 0, j, valuePrimal.at(j), valueColDual.at(j), cost);
			}
		}

	return ss.str();
}